

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall Player::~Player(Player *this)

{
  (this->super_Subject)._vptr_Subject = (_func_int **)&PTR_attach_00121940;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->zoneNames);
  std::_Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>::~_Vector_base
            (&(this->buildingUnitTiles).
              super__Vector_base<BuildingUnitTiles,_std::allocator<BuildingUnitTiles>_>);
  std::vector<GameTokens,_std::allocator<GameTokens>_>::~vector(&this->gameTokens);
  std::vector<Cards,_std::allocator<Cards>_>::~vector(&this->cards);
  MonsterCards::~MonsterCards(&(this->boardFigure).super_MonsterCards);
  MonsterCards::~MonsterCards(&this->monsterCard);
  std::__cxx11::string::~string((string *)&this->playerName);
  Subject::~Subject(&this->super_Subject);
  return;
}

Assistant:

Player::~Player() {

}